

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::RecordLegacyLocation
          (LocationRecorder *this,Message *descriptor,ErrorLocation location)

{
  int iVar1;
  map<std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,_std::pair<int,_int>,_std::less<std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,_std::pair<int,_int>_>_>_>
  *this_00;
  Location *pLVar2;
  int iVar3;
  LogMessage *pLVar4;
  mapped_type *pmVar5;
  Location *pLVar6;
  LogFinisher local_69;
  LogMessage local_68;
  
  this_00 = &this->parser_->source_location_table_->location_map_;
  if (this_00 !=
      (map<std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,_std::pair<int,_int>,_std::less<std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,_std::pair<int,_int>_>_>_>
       *)0x0) {
    pLVar2 = this->location_;
    iVar3 = (pLVar2->span_).current_size_;
    pLVar6 = pLVar2;
    if (iVar3 < 1) {
      internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/repeated_field.h"
                 ,0x265);
      pLVar4 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (index) < (size()): ");
      internal::LogFinisher::operator=(&local_69,pLVar4);
      internal::LogMessage::~LogMessage(&local_68);
      iVar3 = (this->location_->span_).current_size_;
      pLVar6 = this->location_;
    }
    iVar1 = *(pLVar2->span_).elements_;
    if (iVar3 < 2) {
      internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/repeated_field.h"
                 ,0x265);
      pLVar4 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (index) < (size()): ");
      internal::LogFinisher::operator=(&local_69,pLVar4);
      internal::LogMessage::~LogMessage(&local_68);
    }
    iVar3 = (pLVar6->span_).elements_[1];
    local_68._0_8_ = descriptor;
    local_68.filename_._0_4_ = location;
    pmVar5 = std::
             map<std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,_std::pair<int,_int>,_std::less<std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,_std::pair<int,_int>_>_>_>
             ::operator[](this_00,(key_type *)&local_68);
    pmVar5->first = iVar1;
    pmVar5->second = iVar3;
  }
  return;
}

Assistant:

void Parser::LocationRecorder::RecordLegacyLocation(const Message* descriptor,
    DescriptorPool::ErrorCollector::ErrorLocation location) {
  if (parser_->source_location_table_ != NULL) {
    parser_->source_location_table_->Add(
        descriptor, location, location_->span(0), location_->span(1));
  }
}